

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O3

int ecp_mul_comb(mbedtls_ecp_group *grp,mbedtls_ecp_point *R,mbedtls_mpi *m,mbedtls_ecp_point *P,
                _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong d;
  mbedtls_ecp_point *P_00;
  size_t t_len;
  mbedtls_ecp_point *pmVar4;
  byte bVar5;
  mbedtls_ecp_point *R_00;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  bool bVar12;
  byte local_1d4;
  mbedtls_mpi M;
  mbedtls_mpi mm;
  uchar k [262];
  
  mbedtls_mpi_init(&M);
  mbedtls_mpi_init(&mm);
  iVar1 = mbedtls_mpi_get_bit(&grp->N,0);
  if (iVar1 != 1) {
    return -0x4f80;
  }
  uVar6 = grp->nbits;
  iVar1 = mbedtls_mpi_cmp_mpi(&P->Y,&(grp->G).Y);
  if (iVar1 == 0) {
    iVar1 = mbedtls_mpi_cmp_mpi(&P->X,&(grp->G).X);
    bVar12 = iVar1 == 0;
  }
  else {
    bVar12 = false;
  }
  bVar5 = (0x17f < uVar6 | 4U) + bVar12;
  uVar6 = 2;
  if ((ulong)bVar5 < grp->nbits) {
    uVar6 = (ulong)bVar5;
  }
  uVar9 = 1 << ((uchar)uVar6 - 1 & 0x1f);
  uVar3 = (grp->nbits + uVar6) - 1;
  d = uVar3 / uVar6;
  local_1d4 = (byte)uVar9;
  if ((bVar12 == false) || (P_00 = grp->T, P_00 == (mbedtls_ecp_point *)0x0)) {
    P_00 = (mbedtls_ecp_point *)calloc((ulong)uVar9,0x48);
    if (P_00 == (mbedtls_ecp_point *)0x0) {
      iVar1 = -0x4d80;
      goto LAB_00165fde;
    }
    iVar1 = mbedtls_ecp_copy(P_00,P);
    if (iVar1 == 0) {
      uVar8 = 1;
      bVar5 = 0;
      do {
        pmVar4 = P_00 + uVar8;
        iVar1 = mbedtls_ecp_copy(pmVar4,P_00 + (uVar8 >> 1));
        if (iVar1 != 0) goto LAB_00165fa9;
        uVar10 = d;
        if (uVar6 <= uVar3) {
          do {
            iVar1 = ecp_double_jac(grp,pmVar4,pmVar4);
            if (iVar1 != 0) goto LAB_00165fa9;
            uVar10 = uVar10 - 1;
          } while (uVar10 != 0);
        }
        uVar10 = (ulong)bVar5;
        bVar5 = bVar5 + 1;
        *(mbedtls_ecp_point **)(k + uVar10 * 8) = pmVar4;
        uVar7 = (int)uVar8 * 2 & 0xff;
        uVar8 = (ulong)uVar7;
      } while (uVar7 < uVar9);
      iVar1 = ecp_normalize_jac_many(grp,(mbedtls_ecp_point **)k,(ulong)bVar5);
      if (iVar1 == 0) {
        uVar3 = 1;
        t_len = 0;
        do {
          uVar8 = uVar3 & 0xff;
          iVar2 = (int)uVar8;
          if ((char)uVar3 != '\0') {
            lVar11 = (ulong)(uint)(iVar2 * 8) * 9;
            pmVar4 = (mbedtls_ecp_point *)((long)&P_00[-1].X.s + lVar11);
            R_00 = (mbedtls_ecp_point *)((long)&P_00[-1].X.s + (ulong)(uint)(iVar2 * 0x90));
            uVar3 = t_len;
            do {
              iVar1 = ecp_add_mixed(grp,R_00,pmVar4,
                                    (mbedtls_ecp_point *)((long)&(P_00->X).s + lVar11));
              if (iVar1 != 0) goto LAB_00165fa9;
              uVar8 = uVar8 - 1;
              t_len = (size_t)(byte)((char)uVar3 + 1);
              *(mbedtls_ecp_point **)(k + uVar3 * 8) = R_00;
              pmVar4 = pmVar4 + -1;
              R_00 = R_00 + -1;
              uVar3 = t_len;
            } while (uVar8 != 0);
          }
          uVar3 = (ulong)(uint)(iVar2 * 2);
        } while ((byte)(iVar2 * 2) < local_1d4);
        iVar1 = ecp_normalize_jac_many(grp,(mbedtls_ecp_point **)k,t_len);
        if (iVar1 == 0) {
          if (bVar12 != false) {
            grp->T = P_00;
            grp->T_size = (ulong)uVar9;
          }
          goto LAB_00165de4;
        }
      }
    }
  }
  else {
LAB_00165de4:
    iVar2 = mbedtls_mpi_get_bit(m,0);
    iVar1 = mbedtls_mpi_copy(&M,m);
    if ((iVar1 == 0) && (iVar1 = mbedtls_mpi_sub_mpi(&mm,&grp->N,m), iVar1 == 0)) {
      iVar1 = mbedtls_mpi_safe_cond_assign(&M,&mm,iVar2 != 1);
      if (iVar1 == 0) {
        ecp_comb_fixed(k,d,(uchar)uVar6,&M);
        iVar1 = ecp_mul_comb_core(grp,R,P_00,local_1d4,k,d,f_rng,p_rng);
        if ((iVar1 == 0) && (iVar1 = ecp_safe_invert_jac(grp,R,iVar2 != 1), iVar1 == 0)) {
          iVar1 = ecp_normalize_jac(grp,R);
        }
      }
    }
  }
LAB_00165fa9:
  if (bVar12 == false) {
    lVar11 = 0;
    do {
      mbedtls_ecp_point_free((mbedtls_ecp_point *)((long)&(P_00->X).s + lVar11));
      lVar11 = lVar11 + 0x48;
    } while ((ulong)((uVar9 & 0xff) + (uint)((uVar9 & 0xff) == 0)) * 0x48 != lVar11);
    free(P_00);
  }
LAB_00165fde:
  mbedtls_mpi_free(&M);
  mbedtls_mpi_free(&mm);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    mbedtls_ecp_point_free(R);
  }
  return iVar1;
}

Assistant:

static int ecp_mul_comb( mbedtls_ecp_group *grp, mbedtls_ecp_point *R,
                         const mbedtls_mpi *m, const mbedtls_ecp_point *P,
                         int (*f_rng)(void *, unsigned char *, size_t),
                         void *p_rng )
{
    int ret;
    unsigned char w, m_is_odd, p_eq_g, pre_len, i;
    size_t d;
    unsigned char k[COMB_MAX_D + 1];
    mbedtls_ecp_point *T;
    mbedtls_mpi M, mm;

    mbedtls_mpi_init( &M );
    mbedtls_mpi_init( &mm );

    /* we need N to be odd to trnaform m in an odd number, check now */
    if( mbedtls_mpi_get_bit( &grp->N, 0 ) != 1 )
        return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );

    /*
     * Minimize the number of multiplications, that is minimize
     * 10 * d * w + 18 * 2^(w-1) + 11 * d + 7 * w, with d = ceil( nbits / w )
     * (see costs of the various parts, with 1S = 1M)
     */
    w = grp->nbits >= 384 ? 5 : 4;

    /*
     * If P == G, pre-compute a bit more, since this may be re-used later.
     * Just adding one avoids upping the cost of the first mul too much,
     * and the memory cost too.
     */
#if MBEDTLS_ECP_FIXED_POINT_OPTIM == 1
    p_eq_g = ( mbedtls_mpi_cmp_mpi( &P->Y, &grp->G.Y ) == 0 &&
               mbedtls_mpi_cmp_mpi( &P->X, &grp->G.X ) == 0 );
    if( p_eq_g )
        w++;
#else
    p_eq_g = 0;
#endif

    /*
     * Make sure w is within bounds.
     * (The last test is useful only for very small curves in the test suite.)
     */
    if( w > MBEDTLS_ECP_WINDOW_SIZE )
        w = MBEDTLS_ECP_WINDOW_SIZE;
    if( w >= grp->nbits )
        w = 2;

    /* Other sizes that depend on w */
    pre_len = 1U << ( w - 1 );
    d = ( grp->nbits + w - 1 ) / w;

    /*
     * Prepare precomputed points: if P == G we want to
     * use grp->T if already initialized, or initialize it.
     */
    T = p_eq_g ? grp->T : NULL;

    if( T == NULL )
    {
        T = mbedtls_calloc( pre_len, sizeof( mbedtls_ecp_point ) );
        if( T == NULL )
        {
            ret = MBEDTLS_ERR_ECP_ALLOC_FAILED;
            goto cleanup;
        }

        MBEDTLS_MPI_CHK( ecp_precompute_comb( grp, T, P, w, d ) );

        if( p_eq_g )
        {
            grp->T = T;
            grp->T_size = pre_len;
        }
    }

    /*
     * Make sure M is odd (M = m or M = N - m, since N is odd)
     * using the fact that m * P = - (N - m) * P
     */
    m_is_odd = ( mbedtls_mpi_get_bit( m, 0 ) == 1 );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &M, m ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &mm, &grp->N, m ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_safe_cond_assign( &M, &mm, ! m_is_odd ) );

    /*
     * Go for comb multiplication, R = M * P
     */
    ecp_comb_fixed( k, d, w, &M );
    MBEDTLS_MPI_CHK( ecp_mul_comb_core( grp, R, T, pre_len, k, d, f_rng, p_rng ) );

    /*
     * Now get m * P from M * P and normalize it
     */
    MBEDTLS_MPI_CHK( ecp_safe_invert_jac( grp, R, ! m_is_odd ) );
    MBEDTLS_MPI_CHK( ecp_normalize_jac( grp, R ) );

cleanup:

    if( T != NULL && ! p_eq_g )
    {
        for( i = 0; i < pre_len; i++ )
            mbedtls_ecp_point_free( &T[i] );
        mbedtls_free( T );
    }

    mbedtls_mpi_free( &M );
    mbedtls_mpi_free( &mm );

    if( ret != 0 )
        mbedtls_ecp_point_free( R );

    return( ret );
}